

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::Option::ByteSizeLong(Option *this)

{
  uint uVar1;
  uint32_t *puVar2;
  ulong uVar3;
  string *value;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  Option *this_;
  Option *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_(this);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        value = _internal_name_abi_cxx11_(this);
        sStack_58 = internal::WireFormatLite::StringSize(value);
        sStack_58 = sStack_58 + 1;
      }
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.value_);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t Option::ByteSizeLong() const {
  const Option& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.Option)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_name().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_name());
      }
    }
    // .google.protobuf.Any value = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.value_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}